

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  locale *plVar4;
  basic_format_specs<char> *pbVar5;
  char cVar6;
  uint uVar7;
  numpunct *pnVar8;
  char *pcVar9;
  buffer_appender<char> bVar10;
  buffer<char> *buf;
  uint uVar11;
  long *plVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  ulong size;
  int iVar20;
  bool bVar21;
  string groups;
  char digits [40];
  long *local_2a0;
  long local_298;
  long local_290 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_int> *local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar4 = (locale *)(this->locale).locale_;
  if (plVar4 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar4);
  }
  pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar8 + 0x20))(&local_2a0,pnVar8);
  std::locale::~locale((locale *)&local_248);
  if (local_298 == 0) {
    on_dec(this);
    goto LAB_00118a09;
  }
  plVar4 = (locale *)(this->locale).locale_;
  if (plVar4 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar4);
  }
  pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  cVar6 = (**(code **)(*(long *)pnVar8 + 0x18))(pnVar8);
  std::locale::~locale((locale *)&local_248);
  if (cVar6 == '\0') {
    on_dec(this);
    goto LAB_00118a09;
  }
  uVar13 = this->abs_value;
  uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)(LZCOUNT(uVar13 | 1) ^ 0x1f) * 2);
  uVar18 = (uint)uVar3 -
           (uint)(uVar13 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                    (ulong)uVar3 * 4));
  iVar20 = -(uint)(uVar13 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new +
                                     (ulong)uVar3 * 4));
  bVar21 = local_298 == 0;
  uVar7 = uVar18;
  uVar11 = uVar18;
  if (bVar21) {
LAB_001187e4:
    uVar11 = uVar11 + (int)(uVar7 - 1) / (int)*(char *)((long)local_2a0 + local_298 + -1);
  }
  else {
    iVar15 = (int)(char)*local_2a0;
    if (0x81 < (byte)((char)*local_2a0 + 0x81U) && iVar15 < (int)uVar18) {
      uVar11 = (int)local_298 + iVar20 + (uint)uVar3;
      lVar16 = 0;
      do {
        uVar7 = uVar7 - iVar15;
        bVar21 = local_298 + -1 == lVar16;
        if (bVar21) goto LAB_001187e4;
        cVar2 = *(char *)((long)local_2a0 + lVar16 + 1);
        iVar15 = (int)cVar2;
        lVar16 = lVar16 + 1;
      } while ((iVar15 < (int)uVar7) && (0x81 < (byte)(cVar2 + 0x81U)));
      uVar11 = (int)lVar16 + uVar18;
    }
    if (bVar21) goto LAB_001187e4;
  }
  pcVar9 = local_278 + (int)uVar18;
  uVar7 = uVar13;
  if (99 < uVar13) {
    do {
      uVar13 = uVar7 / 100;
      *(undefined2 *)(pcVar9 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar7 % 100) * 2);
      pcVar9 = pcVar9 + -2;
      bVar21 = 9999 < uVar7;
      uVar7 = uVar7 / 100;
    } while (bVar21);
  }
  if (uVar13 < 10) {
    pcVar9[-1] = (byte)uVar13 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar9 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar13 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00127d58;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar11 = uVar11 + this->prefix_size;
  if (-1 < (int)uVar11) {
    size = (ulong)uVar11;
    if (500 < uVar11) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
    }
    pcVar9 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (size <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = size;
    }
    pcVar17 = local_248.super_buffer<char>.ptr_ + (size - 1);
    if (1 < (int)uVar18) {
      uVar14 = (ulong)uVar18;
      iVar15 = iVar20 + 1 + (uint)uVar3;
      iVar20 = 0;
      plVar12 = local_2a0;
      do {
        uVar14 = uVar14 - 1;
        pcVar1 = pcVar17 + -1;
        *pcVar17 = local_278[uVar14 & 0xffffffff];
        cVar2 = (char)*plVar12;
        if ('\0' < cVar2) {
          iVar20 = iVar20 + 1;
          if ((cVar2 != '\x7f') && (iVar20 % (int)cVar2 == 0)) {
            if ((long *)((long)plVar12 + 1) != (long *)((long)local_2a0 + local_298)) {
              iVar20 = 0;
              plVar12 = (long *)((long)plVar12 + 1);
            }
            pcVar17[-1] = cVar6;
            pcVar1 = pcVar17 + -2;
          }
        }
        pcVar17 = pcVar1;
        iVar15 = iVar15 + -1;
      } while (2 < iVar15);
    }
    *pcVar17 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar17[-1] = '-';
    }
    pbVar5 = this->specs;
    uVar14 = (ulong)pbVar5->width;
    if (-1 < (long)uVar14) {
      bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      uVar19 = 0;
      if (size <= uVar14) {
        uVar19 = uVar14 - size;
      }
      cVar6 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar5->field_0x9 & 0xf));
      local_280 = this;
      if (*(ulong *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + size + (pbVar5->fill).size_ * uVar19) {
        (*(code *)**(undefined8 **)
                    bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar14 = uVar19 >> ((long)cVar6 & 0x3fU);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar10,uVar14,&pbVar5->fill);
      bVar10 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>(pcVar9,pcVar9 + size,bVar10);
      bVar10 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar10,uVar19 - uVar14,&pbVar5->fill);
      (local_280->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar10.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
LAB_00118a09:
      if (local_2a0 != local_290) {
        operator_delete(local_2a0,local_290[0] + 1);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }